

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<llvm::SMFixIt>::append<llvm::SMFixIt_const*,void>
          (SmallVectorImpl<llvm::SMFixIt> *this,SMFixIt *in_start,SMFixIt *in_end)

{
  undefined4 *puVar1;
  long lVar2;
  string *psVar3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar11 = ((long)in_end - (long)in_start >> 4) * -0x5555555555555555;
  uVar10 = (ulong)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  uVar8 = (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
          super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Capacity -
          uVar10;
  if (uVar8 <= uVar11 && uVar11 - uVar8 != 0) {
    SmallVectorTemplateBase<llvm::SMFixIt,_false>::grow
              (&this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>,uVar10 + uVar11);
    uVar10 = (ulong)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                    super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  }
  if (in_start != in_end) {
    pvVar4 = (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
             super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
    lVar9 = 0;
    do {
      puVar1 = (undefined4 *)((long)&(in_start->Range).Start.Ptr + lVar9);
      uVar5 = puVar1[1];
      uVar6 = puVar1[2];
      uVar7 = puVar1[3];
      lVar2 = (long)pvVar4 + lVar9 + uVar10 * 0x30 + 0x20;
      *(undefined4 *)(lVar2 + -0x20) = *puVar1;
      *(undefined4 *)(lVar2 + -0x1c) = uVar5;
      *(undefined4 *)(lVar2 + -0x18) = uVar6;
      *(undefined4 *)(lVar2 + -0x14) = uVar7;
      psVar3 = (string *)((long)pvVar4 + lVar9 + uVar10 * 0x30 + 0x10);
      *(long *)psVar3 = lVar2;
      std::__cxx11::string::_M_construct<char*>
                (psVar3,*(long *)(puVar1 + 4),*(long *)(puVar1 + 6) + *(long *)(puVar1 + 4));
      lVar9 = lVar9 + 0x30;
    } while ((SMFixIt *)(puVar1 + 0xc) != in_end);
    uVar10 = (ulong)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                    super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  }
  if (uVar11 + uVar10 <=
      (ulong)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
             super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
    super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size =
         (uint)(uVar11 + uVar10);
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }